

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void help(void)

{
  fwrite("-M [filename] output Moment Period Loss Table (MPLT)\n-m [filename] output MPLT in parquet format\n-Q [filename] output Quantile Period Loss Table (QPLT)\n-q [filename] output QPLT in parquet format\n-S [filename] output Sample Period Loss Table (SPLT)\n-s [filename] output SPLT in parquet format\n-h help\n-v version\n-H skip header\n"
         ,0x147,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
	"-M [filename] output Moment Period Loss Table (MPLT)\n"
	"-m [filename] output MPLT in parquet format\n"
	"-Q [filename] output Quantile Period Loss Table (QPLT)\n"
	"-q [filename] output QPLT in parquet format\n"
	"-S [filename] output Sample Period Loss Table (SPLT)\n"
	"-s [filename] output SPLT in parquet format\n"
	"-h help\n"
	"-v version\n"
	"-H skip header\n"
	);
}